

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

SignalBase<int> * __thiscall
dynamicgraph::SignalPtr<double,_int>::getAbstractPtr(SignalPtr<double,_int> *this)

{
  uint uVar1;
  ExceptionSignal *this_00;
  undefined8 uVar2;
  allocator<char> local_41;
  string local_40 [36];
  ErrorCodeEnum local_1c;
  SignalPtr<double,_int> *local_18;
  SignalPtr<double,_int> *this_local;
  
  local_18 = this;
  uVar1 = (*this->_vptr_SignalPtr[6])();
  if ((uVar1 & 1) == 0) {
    this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_1c = NOT_INITIALIZED;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"In SignalPtr: SIN ptr not set.",&local_41);
    SignalBase<int>::getName_abi_cxx11_
              ((SignalBase<int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
    uVar2 = std::__cxx11::string::c_str();
    dynamicgraph::ExceptionSignal::ExceptionSignal
              (this_00,&local_1c,local_40," (in signal <%s>)",uVar2);
    __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
  }
  if (this->signalPtr == (Signal<double,_int> *)0x0) {
    this_local = (SignalPtr<double,_int> *)this->abstractTransmitter;
  }
  else {
    this_local = (SignalPtr<double,_int> *)this->signalPtr;
  }
  return (SignalBase<int> *)this_local;
}

Assistant:

const SignalBase<Time> *SignalPtr<T, Time>::getAbstractPtr() const {
  if (!isAbstractPluged()) {
    DG_THROW ExceptionSignal(ExceptionSignal::NOT_INITIALIZED,
                             "In SignalPtr: SIN ptr not set.",
                             " (in signal <%s>)", getName().c_str());
  }
  if (NULL != signalPtr)
    return signalPtr;
  else
    return abstractTransmitter;
}